

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O1

void __thiscall mp::SPAdapter::ProcessCons(SPAdapter *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  ColProblem *pCVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pRVar10;
  pointer pBVar11;
  pointer pRVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  vector<int,_std::allocator<int>_> stage_offsets;
  allocator_type local_61;
  long local_60;
  vector<int,_std::allocator<int>_> *local_58;
  size_type local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  lVar18 = ((long)(this->problem_->super_Problem).algebraic_cons_.
                  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->problem_->super_Problem).algebraic_cons_.
                  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f;
  this_00 = &this->num_stage_cons_;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)this->num_stages_);
  iVar14 = (int)lVar18;
  if (iVar14 != 0) {
    local_58 = &this->con_orig2core_;
    local_50 = (size_type)iVar14;
    local_60 = lVar18;
    std::vector<int,_std::allocator<int>_>::resize(local_58,local_50);
    if (1 < this->num_stages_) {
      puVar4 = (uint *)(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start;
      uVar13 = (ulong)*puVar4;
      pCVar5 = this->problem_;
      piVar6 = (this->var_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar18 = 1;
      do {
        uVar17 = puVar4[lVar18];
        if (0 < (int)uVar17) {
          iVar14 = (int)uVar13;
          piVar7 = (pCVar5->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar13 = (ulong)iVar14;
          do {
            lVar19 = (long)piVar6[uVar13];
            iVar2 = piVar7[lVar19];
            iVar3 = piVar7[lVar19 + 1];
            if (iVar3 != iVar2) {
              piVar9 = (pCVar5->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar19 = 0;
              do {
                iVar16 = piVar9[iVar2 + lVar19];
                iVar15 = piVar8[iVar16];
                if (iVar15 <= (int)lVar18) {
                  iVar15 = (int)lVar18;
                }
                piVar8[iVar16] = iVar15;
                lVar19 = lVar19 + 1;
              } while (iVar3 - iVar2 != (int)lVar19);
            }
            uVar13 = uVar13 + 1;
          } while ((long)uVar13 < (long)(int)(uVar17 + iVar14));
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < this->num_stages_);
    }
    pRVar12 = (this->random_vars_).
              super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar10 = (this->random_vars_).
              super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar12 != pRVar10) {
      pCVar5 = this->problem_;
      piVar6 = (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (pCVar5->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        iVar14 = piVar7[pRVar12->var_index];
        iVar2 = piVar7[(long)pRVar12->var_index + 1];
        if (iVar2 != iVar14) {
          piVar8 = (pCVar5->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar18 = 0;
          do {
            iVar3 = piVar8[iVar14 + lVar18];
            iVar16 = piVar6[iVar3];
            if (iVar16 < 2) {
              iVar16 = 1;
            }
            piVar6[iVar3] = iVar16;
            lVar18 = lVar18 + 1;
          } while (iVar2 - iVar14 != (int)lVar18);
        }
        pRVar12 = pRVar12 + 1;
      } while (pRVar12 != pRVar10);
    }
    if (0 < (int)(uint)local_60) {
      uVar17 = (uint)local_60 & 0x7fffffff;
      uVar13 = 0;
      do {
        piVar6 = (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar11 = (this->problem_->super_Problem).nonlinear_cons_.
                  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((uVar13 < (ulong)((long)(this->problem_->super_Problem).nonlinear_cons_.
                                    super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar11 >> 3)
            ) && (pBVar11[uVar13].super_ExprBase.impl_ != (Impl *)0x0)) {
          iVar14 = piVar6[uVar13];
          if (iVar14 < 2) {
            iVar14 = 1;
          }
          piVar6[uVar13] = iVar14;
        }
        if ((int)((ulong)((long)(this->num_stage_cons_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2) <= piVar6[uVar13]) {
          std::vector<int,_std::allocator<int>_>::resize(this_00,(long)piVar6[uVar13] + 1);
        }
        piVar1 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + piVar6[uVar13];
        *piVar1 = *piVar1 + 1;
        uVar13 = uVar13 + 1;
      } while (uVar17 != uVar13);
    }
    uVar13 = (long)(this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) < uVar13) {
      iVar14 = (int)(uVar13 >> 2);
      this->num_stages_ = iVar14;
      std::vector<int,_std::allocator<int>_>::resize(&this->num_stage_vars_,(long)iVar14);
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->con_core2orig_,local_50);
    std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)this->num_stages_,&local_61);
    if (1 < this->num_stages_) {
      piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar14 = *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar18 = 1;
      do {
        iVar14 = iVar14 + piVar6[lVar18 + -1];
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar18] = iVar14;
        lVar18 = lVar18 + 1;
      } while (lVar18 < this->num_stages_);
    }
    if (0 < (int)(uint)local_60) {
      piVar6 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = 0;
      do {
        iVar14 = piVar6[uVar13];
        iVar2 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar14];
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar14] = iVar2 + 1;
        piVar7[iVar2] = (int)uVar13;
        piVar6[uVar13] = iVar2;
        uVar13 = uVar13 + 1;
      } while (((uint)local_60 & 0x7fffffff) != uVar13);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void SPAdapter::ProcessCons() {
  int num_cons = problem_.num_algebraic_cons();
  num_stage_cons_.resize(num_stages_);
  if (num_cons == 0)
    return;
  // Compute stage of each constraint as a maximum of stages of variables
  // in it and temporarily store stages in con_orig2core_.
  con_orig2core_.resize(num_cons);
  int core_var_index = num_stage_vars_[0];
  for (int stage = 1; stage < num_stages_; ++stage) {
    for (int n = core_var_index + num_stage_vars_[stage];
         core_var_index < n; ++core_var_index) {
      UpdateConStages(var_core2orig_[core_var_index], stage);
    }
  }
  // Constraints containing random variables should be at least in the
  // second stage.
  for (auto i = random_vars_.begin(), end = random_vars_.end(); i != end; ++i)
    UpdateConStages(i->var_index, 1);
  for (int i = 0; i < num_cons; ++i) {
    int &stage = con_orig2core_[i];
    if (problem_.algebraic_con(i).nonlinear_expr())
      stage = std::max(con_orig2core_[i], 1);
    if (stage >= static_cast<int>(num_stage_cons_.size()))
      num_stage_cons_.resize(stage + 1);
    ++num_stage_cons_[stage];
  }
  if (num_stage_cons_.size() > num_stage_vars_.size()) {
    num_stages_ = (int)num_stage_cons_.size();
    num_stage_vars_.resize(num_stages_);
  }
  // Reorder constraints by stages.
  con_core2orig_.resize(num_cons);
  std::vector<int> stage_offsets(num_stages_);
  for (int i = 1; i < num_stages_; ++i)
    stage_offsets[i] = stage_offsets[i - 1] + num_stage_cons_[i - 1];
  for (int i = 0; i < num_cons; ++i) {
    int stage = con_orig2core_[i];
    int core_con_index = stage_offsets[stage]++;
    con_core2orig_[core_con_index] = i;
    con_orig2core_[i] = core_con_index++;
  }
}